

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_coin.cpp
# Opt level: O1

int CfdGetEstimateFee(void *handle,void *fee_handle,char *tx_hex,char *fee_asset,bool is_blind,
                     double effective_fee_rate,int64_t *txout_fee,int64_t *utxo_fee)

{
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> *utxos;
  void *pvVar1;
  bool bVar2;
  int64_t iVar3;
  CfdException *pCVar4;
  undefined1 local_d0 [45];
  allocator local_a3;
  allocator local_a2;
  ElementsTransactionApi api;
  Amount utxo_fee_amt;
  Amount tx_fee_amt;
  string local_70;
  TransactionApi api_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cfd::Initialize();
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"EstimateFeeData","");
  cfd::capi::CheckBuffer(fee_handle,(string *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (txout_fee == (int64_t *)0x0) {
    local_d0._0_8_ = "cfdcapi_coin.cpp";
    local_d0._8_4_ = 0x31c;
    local_d0._16_8_ = "CfdGetEstimateFee";
    cfd::core::logger::log<>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"txout fee is null.")
    ;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to parameter. txout fee is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (utxo_fee == (int64_t *)0x0) {
    local_d0._0_8_ = "cfdcapi_coin.cpp";
    local_d0._8_4_ = 0x322;
    local_d0._16_8_ = "CfdGetEstimateFee";
    cfd::core::logger::log<>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"utxo fee is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to parameter. utxo fee is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((*(char *)((long)fee_handle + 0x10) == '\x01') &&
     (bVar2 = cfd::capi::IsEmptyString(fee_asset), bVar2)) {
    local_d0._0_8_ = "cfdcapi_coin.cpp";
    local_d0._8_4_ = 0x329;
    local_d0._16_8_ = "CfdGetEstimateFee";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"fee asset is empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to parameter. fee asset is empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Amount::Amount(&tx_fee_amt);
  cfd::core::Amount::Amount(&utxo_fee_amt);
  if (*(char *)((long)fee_handle + 0x10) == '\x01') {
    std::__cxx11::string::string((string *)&api_1,tx_hex,&local_a2);
    utxos = *(vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              **)((long)fee_handle + 0x18);
    std::__cxx11::string::string((string *)&local_70,fee_asset,&local_a3);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_d0,&local_70);
    cfd::api::ElementsTransactionApi::EstimateFee
              (&api,(string *)&api_1,utxos,(ConfidentialAssetId *)local_d0,&tx_fee_amt,&utxo_fee_amt
               ,is_blind,effective_fee_rate,*(int *)((long)fee_handle + 0x28),
               *(int *)((long)fee_handle + 0x2c),(uint32_t *)0x0);
    local_d0._0_8_ = &PTR__ConfidentialAssetId_0087ccc8;
    pvVar1 = (void *)CONCAT44(local_d0._12_4_,local_d0._8_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_d0._24_8_ - (long)pvVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_d0._16_8_ = local_40._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_api_1 == &local_40) goto LAB_0041e058;
  }
  else {
    std::__cxx11::string::string((string *)local_d0,tx_hex,(allocator *)&local_70);
    cfd::api::TransactionApi::EstimateFee
              (&api_1,(string *)local_d0,
               *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)((long)fee_handle + 0x20),
               &tx_fee_amt,&utxo_fee_amt,effective_fee_rate);
    _api_1 = (pointer)local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) goto LAB_0041e058;
  }
  operator_delete(_api_1,local_d0._16_8_ + 1);
LAB_0041e058:
  iVar3 = cfd::core::Amount::GetSatoshiValue(&tx_fee_amt);
  *txout_fee = iVar3;
  iVar3 = cfd::core::Amount::GetSatoshiValue(&utxo_fee_amt);
  *utxo_fee = iVar3;
  return 0;
}

Assistant:

int CfdGetEstimateFee(
    void* handle, void* fee_handle, const char* tx_hex, const char* fee_asset,
    bool is_blind, double effective_fee_rate,
    int64_t* txout_fee, int64_t* utxo_fee) {
  try {
    cfd::Initialize();
    CheckBuffer(fee_handle, kPrefixEstimateFeeData);
    CfdCapiEstimateFeeData* buffer =
        static_cast<CfdCapiEstimateFeeData*>(fee_handle);
    if (txout_fee == nullptr) {
      warn(CFD_LOG_SOURCE, "txout fee is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txout fee is null.");
    }
    if (utxo_fee == nullptr) {
      warn(CFD_LOG_SOURCE, "utxo fee is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. utxo fee is null.");
    }
#ifndef CFD_DISABLE_ELEMENTS
    if (buffer->is_elements && IsEmptyString(fee_asset)) {
      warn(CFD_LOG_SOURCE, "fee asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fee asset is empty.");
    }
#else
    info(CFD_LOG_SOURCE, "unuse fee asset[{}]", fee_asset);
#endif  // CFD_DISABLE_ELEMENTS

    Amount tx_fee_amt, utxo_fee_amt;
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionApi api;
      api.EstimateFee(
          std::string(tx_hex), *(buffer->input_elements_utxos),
          ConfidentialAssetId(fee_asset), &tx_fee_amt, &utxo_fee_amt, is_blind,
          effective_fee_rate, buffer->exponent, buffer->minimum_bits);
#endif  // CFD_DISABLE_ELEMENTS
    } else {
      TransactionApi api;
      api.EstimateFee(
          std::string(tx_hex), *(buffer->input_utxos), &tx_fee_amt,
          &utxo_fee_amt, effective_fee_rate);
    }
    *txout_fee = tx_fee_amt.GetSatoshiValue();
    *utxo_fee = utxo_fee_amt.GetSatoshiValue();

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}